

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

string * __thiscall
smf::MidiFile::getGMInstrumentName_abi_cxx11_
          (string *__return_storage_ptr__,MidiFile *this,int patchIndex)

{
  char *pcVar1;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  int local_14;
  string *psStack_10;
  int patchIndex_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (local_14 < 0x80) {
    pcVar1 = *(char **)(GMinstrument + (long)local_14 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MidiFile::getGMInstrumentName(int patchIndex) {
	if (patchIndex < 0) {
		return "";
	}
	if (patchIndex > 127) {
		return "";
	}
	return GMinstrument[patchIndex];
}